

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O1

void proto2_unittest::TestRedactedMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  MessageLite *from_msg_00;
  _func_int **pp_Var3;
  Nonnull<const_char_*> pcVar4;
  Arena *pAVar5;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((char)uVar1 != '\0') {
      if ((uVar1 & 1) != 0) {
        uVar2 = from_msg[1]._internal_metadata_.ptr_;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
        pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[1]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 & 2) != 0) {
        pp_Var3 = from_msg[2]._vptr_MessageLite;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
        pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 2),(string *)((ulong)pp_Var3 & 0xfffffffffffffffc),
                   pAVar5);
      }
      if ((uVar1 & 4) != 0) {
        uVar2 = from_msg[2]._internal_metadata_.ptr_;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
        pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[2]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 & 8) != 0) {
        pp_Var3 = from_msg[3]._vptr_MessageLite;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 8;
        pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 3),(string *)((ulong)pp_Var3 & 0xfffffffffffffffc),
                   pAVar5);
      }
      if ((uVar1 & 0x10) != 0) {
        uVar2 = from_msg[3]._internal_metadata_.ptr_;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x10;
        pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[3]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 & 0x20) != 0) {
        pp_Var3 = from_msg[4]._vptr_MessageLite;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x20;
        pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 4),(string *)((ulong)pp_Var3 & 0xfffffffffffffffc),
                   pAVar5);
      }
      if ((uVar1 & 0x40) != 0) {
        uVar2 = from_msg[4]._internal_metadata_.ptr_;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x40;
        pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[4]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
      }
      if ((char)uVar1 < '\0') {
        pp_Var3 = from_msg[5]._vptr_MessageLite;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x80;
        pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 5),(string *)((ulong)pp_Var3 & 0xfffffffffffffffc),
                   pAVar5);
      }
    }
    if ((uVar1 & 0x300) != 0) {
      if ((uVar1 >> 8 & 1) != 0) {
        uVar2 = from_msg[5]._internal_metadata_.ptr_;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x100;
        pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[5]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 >> 9 & 1) != 0) {
        from_msg_00 = (MessageLite *)from_msg[6]._vptr_MessageLite;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((TestRedactedMessage *)&stack0xffffffffffffffd0);
          goto LAB_00d2ff74;
        }
        if ((MessageLite *)to_msg[6]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var3 = (_func_int **)
                    google::protobuf::Arena::CopyConstruct<google::protobuf::Any>(arena,from_msg_00)
          ;
          to_msg[6]._vptr_MessageLite = pp_Var3;
        }
        else {
          google::protobuf::Any::MergeImpl((MessageLite *)to_msg[6]._vptr_MessageLite,from_msg_00);
        }
      }
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_00d2ff74:
  MergeImpl();
}

Assistant:

void TestRedactedMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestRedactedMessage*>(&to_msg);
  auto& from = static_cast<const TestRedactedMessage&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestRedactedMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_text_field(from._internal_text_field());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_meta_annotated(from._internal_meta_annotated());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_repeated_meta_annotated(from._internal_repeated_meta_annotated());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_unredacted_repeated_annotations(from._internal_unredacted_repeated_annotations());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_internal_set_unreported_non_meta_debug_redact_field(from._internal_unreported_non_meta_debug_redact_field());
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_internal_set_redactable_false(from._internal_redactable_false());
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_internal_set_test_direct_message_enum(from._internal_test_direct_message_enum());
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_internal_set_test_nested_message_enum(from._internal_test_nested_message_enum());
    }
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_internal_set_test_redacted_message_enum(from._internal_test_redacted_message_enum());
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.any_field_ != nullptr);
      if (_this->_impl_.any_field_ == nullptr) {
        _this->_impl_.any_field_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.any_field_);
      } else {
        _this->_impl_.any_field_->MergeFrom(*from._impl_.any_field_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}